

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O2

char ** new_attrib(char **in)

{
  char **ppcVar1;
  char *pcVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  uVar5 = 0xffffffffffffffff;
  do {
    iVar4 = (int)uVar5;
    uVar5 = (ulong)(iVar4 + 1);
  } while (in[uVar5] != (char *)0x0);
  ppcVar1 = (char **)__ckd_calloc__((ulong)(iVar4 + 2),8,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
                                    ,0xd0);
  for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    pcVar2 = strdup(in[uVar3]);
    ppcVar1[uVar3] = pcVar2;
  }
  ppcVar1[uVar5] = (char *)0x0;
  return ppcVar1;
}

Assistant:

char **new_attrib(const char **in)
{
    char **out;
    uint32 len, i;

    for (len = 0; in[len]; len++);

    out = (char **)ckd_calloc(len+1, sizeof(char *));

    for (i = 0; i < len; i++) {
	out[i] = strdup(in[i]);
    }

    out[i] = NULL;

    return out;
}